

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

string * CLI::detail::to_lower(string *str)

{
  iterator iVar1;
  iterator iVar2;
  iterator iVar3;
  string *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  
  iVar1 = ::std::begin<std::__cxx11::string>(in_stack_ffffffffffffffa8);
  iVar2 = ::std::end<std::__cxx11::string>(in_stack_ffffffffffffffa8);
  iVar3 = ::std::begin<std::__cxx11::string>(in_stack_ffffffffffffffa8);
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
            (iVar1._M_current,iVar2._M_current,iVar3._M_current);
  ::std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

inline std::string to_lower(std::string str) {
    std::transform(std::begin(str), std::end(str), std::begin(str), [](const std::string::value_type &x) {
        return std::tolower(x, std::locale());
    });
    return str;
}